

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void __thiscall spirv_cross::Bitset::merge_and(Bitset *this,Bitset *other)

{
  bool bVar1;
  reference __x;
  size_type sVar2;
  uint *v;
  iterator __end2;
  iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  tmp_set;
  Bitset *other_local;
  Bitset *this_local;
  
  this->lower = other->lower & this->lower;
  tmp_set._M_h._M_single_bucket = (__node_base_ptr)other;
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&__range2);
  __end2 = ::std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin(&this->higher);
  v = (uint *)::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::end(&this->higher);
  while( true ) {
    bVar1 = ::std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                       (_Node_iterator_base<unsigned_int,_false> *)&v);
    if (!bVar1) break;
    __x = ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    sVar2 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)(tmp_set._M_h._M_single_bucket + 1),__x);
    if (sVar2 != 0) {
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)&__range2,__x);
    }
    ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  }
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::operator=(&this->higher,
              (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&__range2);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&__range2);
  return;
}

Assistant:

inline void merge_and(const Bitset &other)
	{
		lower &= other.lower;
		std::unordered_set<uint32_t> tmp_set;
		for (auto &v : higher)
			if (other.higher.count(v) != 0)
				tmp_set.insert(v);
		higher = std::move(tmp_set);
	}